

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::string_t,short>
          (BaseAppender *this,Vector *col,string_t input)

{
  short sVar1;
  
  sVar1 = Cast::Operation<duckdb::string_t,short>(input);
  *(short *)(col->data + (this->chunk).count * 2) = sVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}